

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserAdams.cpp
# Opt level: O3

void chrono::utils::parseADMJoint
               (string *ID,
               vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *tokens,ChSystem *sys)

{
  size_t sVar1;
  long *plVar2;
  int iVar3;
  string *psVar4;
  pointer ppVar5;
  bool bVar6;
  long *local_68;
  size_t local_60;
  long local_58 [2];
  mapped_type *local_48;
  string *local_40;
  string *local_38;
  
  local_48 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_joint_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_joint_struct>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_joint_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_joint_struct>_>_>
                           *)joints_map_abi_cxx11_,ID);
  ppVar5 = (tokens->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (ppVar5 != (tokens->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_40 = (string *)&local_48->marker_J;
    local_38 = (string *)&local_48->marker_I;
    do {
      if (ppVar5->first == 1) {
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"I","");
        plVar2 = local_68;
        sVar1 = (ppVar5->second)._M_string_length;
        if (sVar1 == local_60) {
          if (sVar1 == 0) {
            bVar6 = true;
          }
          else {
            iVar3 = bcmp((ppVar5->second)._M_dataplus._M_p,local_68,sVar1);
            bVar6 = iVar3 == 0;
          }
        }
        else {
          bVar6 = false;
        }
        if (plVar2 != local_58) {
          operator_delete(plVar2,local_58[0] + 1);
        }
        psVar4 = local_38;
        if (!bVar6) {
          local_68 = local_58;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"J","");
          plVar2 = local_68;
          sVar1 = (ppVar5->second)._M_string_length;
          if (sVar1 == local_60) {
            if (sVar1 == 0) {
              bVar6 = true;
            }
            else {
              iVar3 = bcmp((ppVar5->second)._M_dataplus._M_p,local_68,sVar1);
              bVar6 = iVar3 == 0;
            }
          }
          else {
            bVar6 = false;
          }
          if (plVar2 != local_58) {
            operator_delete(plVar2,local_58[0] + 1);
          }
          psVar4 = local_40;
          if (!bVar6) {
            std::__cxx11::string::_M_assign((string *)local_48);
            goto LAB_0093a84e;
          }
        }
        ppVar5 = ppVar5 + 1;
        std::__cxx11::string::_M_assign(psVar4);
      }
LAB_0093a84e:
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != (tokens->
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void parseADMJoint(std::string ID, std::vector<std::pair<int, std::string>>& tokens, ChSystem& sys) {
    adams_joint_struct& joint = joints_map[ID];  // uses default contructor
    auto iter = tokens.begin();
    while (iter != tokens.end()) {
        // std::cout << "token is " << iter->first << ", " << iter->second <<std::endl;

        if (iter->first == LABEL) {
            if (iter->second == std::string("I")) {
                iter++;  // Get digit
                joint.marker_I = iter->second;
            } else if (iter->second == std::string("J")) {
                iter++;  // Get digit
                joint.marker_J = iter->second;
            } else {
                joint.type = iter->second;
                // std::cout << "type is " << joint.type <<std::endl;
            }
        }

        iter++;
    }
}